

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O2

int impl_sign_picnic3(picnic_instance_t *instance,uint8_t *plaintext,uint8_t *private_key,
                     uint8_t *public_key,uint8_t *msg,size_t msglen,uint8_t *signature,
                     size_t *signature_len)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  uint16_t uVar6;
  size_t __n;
  uint16_t *puVar7;
  uint16_t *puVar8;
  _Bool _Var9;
  int iVar10;
  uint8_t *puVar11;
  randomTape_t *__ptr;
  tree_t *__ptr_00;
  commitments_t *commitments;
  inputs_t inputs;
  msgs_t *msgs;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint16_t *missingLeaves;
  size_t sVar14;
  ulong uVar15;
  size_t t_2;
  long lVar16;
  ulong uVar17;
  commitments_t *C;
  proof2_t *ppVar18;
  uint16_t t;
  uint leafIndex;
  size_t j;
  ulong uVar19;
  size_t t_1;
  size_t sVar20;
  uint8_t **ppuVar21;
  randomTape_t *prVar22;
  size_t *psVar23;
  msgs_t *msgs_00;
  tree_t *ptVar24;
  commitments_t Cv;
  commitments_t Ch;
  signature2_t sig;
  size_t cvInfoLen;
  tree_t iSeedsTree;
  mzd_local_t m_plaintext [1];
  tree_t treeCv;
  uint8_t saltAndRoot [64];
  uint8_t *seed_ptr [4];
  tree_t *local_550;
  msgs_t *local_548;
  int local_4f0;
  commitments_t local_4e0;
  commitments_t local_4d0;
  signature2_t local_4c0;
  uint8_t *local_458;
  lowmc_simulate_online_f local_450;
  size_t local_448;
  tree_t local_440;
  mzd_local_t local_420;
  tree_t local_400;
  uint8_t local_3e0 [8];
  uint8_t auStack_3d8 [8];
  uint8_t auStack_3d0 [8];
  uint8_t auStack_3c8 [8];
  uint8_t local_3c0 [32];
  undefined1 local_3a0 [8];
  uint8_t *puStack_398;
  uint8_t *puStack_390;
  uint8_t *puStack_388;
  
  _Var9 = allocateSignature2(&local_4c0,instance);
  local_4f0 = -1;
  if (_Var9) {
    bVar1 = instance->seed_size;
    hash_init((hash_context *)local_3a0,(ulong)instance->digest_size);
    hash_update((hash_context *)local_3a0,private_key,(ulong)instance->input_output_size);
    local_458 = msg;
    hash_update((hash_context *)local_3a0,msg,msglen);
    hash_update((hash_context *)local_3a0,public_key,(ulong)instance->input_output_size);
    hash_update((hash_context *)local_3a0,plaintext,(ulong)instance->input_output_size);
    hash_update_uint16_le((hash_context *)local_3a0,(instance->lowmc).n);
    hash_final((hash_context *)local_3a0);
    hash_squeeze((hash_context *)local_3a0,local_3e0,(ulong)bVar1 + 0x20);
    local_4c0.salt[0] = local_3e0[0];
    local_4c0.salt[1] = local_3e0[1];
    local_4c0.salt[2] = local_3e0[2];
    local_4c0.salt[3] = local_3e0[3];
    local_4c0.salt[4] = local_3e0[4];
    local_4c0.salt[5] = local_3e0[5];
    local_4c0.salt[6] = local_3e0[6];
    local_4c0.salt[7] = local_3e0[7];
    local_4c0.salt[8] = auStack_3d8[0];
    local_4c0.salt[9] = auStack_3d8[1];
    local_4c0.salt[10] = auStack_3d8[2];
    local_4c0.salt[0xb] = auStack_3d8[3];
    local_4c0.salt[0xc] = auStack_3d8[4];
    local_4c0.salt[0xd] = auStack_3d8[5];
    local_4c0.salt[0xe] = auStack_3d8[6];
    local_4c0.salt[0xf] = auStack_3d8[7];
    local_4c0.salt[0x10] = auStack_3d0[0];
    local_4c0.salt[0x11] = auStack_3d0[1];
    local_4c0.salt[0x12] = auStack_3d0[2];
    local_4c0.salt[0x13] = auStack_3d0[3];
    local_4c0.salt[0x14] = auStack_3d0[4];
    local_4c0.salt[0x15] = auStack_3d0[5];
    local_4c0.salt[0x16] = auStack_3d0[6];
    local_4c0.salt[0x17] = auStack_3d0[7];
    local_4c0.salt[0x18] = auStack_3c8[0];
    local_4c0.salt[0x19] = auStack_3c8[1];
    local_4c0.salt[0x1a] = auStack_3c8[2];
    local_4c0.salt[0x1b] = auStack_3c8[3];
    local_4c0.salt[0x1c] = auStack_3c8[4];
    local_4c0.salt[0x1d] = auStack_3c8[5];
    local_4c0.salt[0x1e] = auStack_3c8[6];
    local_4c0.salt[0x1f] = auStack_3c8[7];
    _Var9 = generateSeeds(&local_440,(uint)instance->num_rounds,local_3c0,local_4c0.salt,0,instance)
    ;
    if (_Var9) {
      puVar11 = getLeaves(&local_440);
      if (puVar11 == (uint8_t *)0x0) {
        local_4f0 = -1;
      }
      else {
        uVar5 = instance->num_rounds;
        __ptr = (randomTape_t *)calloc((ulong)uVar5,0x98);
        __ptr_00 = (tree_t *)calloc((ulong)uVar5,0x20);
        commitments = allocateCommitments(instance,0);
        inputs = allocateInputs(instance);
        msgs = allocateMsgs(instance);
        if ((msgs != (msgs_t *)0x0 &&
            (inputs != (inputs_t)0x0 && commitments != (commitments_t *)0x0)) &&
            (__ptr_00 != (tree_t *)0x0 && __ptr != (randomTape_t *)0x0)) {
          allocateCommitments2(&local_4d0,instance,(ulong)instance->num_rounds);
          allocateCommitments2(&local_4e0,instance,(ulong)instance->num_rounds);
          local_420.w64 = (word  [4])ZEXT1632(ZEXT816(0) << 0x40);
          mzd_from_char_array(&local_420,plaintext,(ulong)instance->input_output_size);
          local_450 = lowmc_simulate_online_get_implementation(&instance->lowmc);
          local_4f0 = -1;
          for (uVar17 = 0; uVar17 < instance->num_rounds; uVar17 = uVar17 + 1) {
            ptVar24 = __ptr_00 + uVar17;
            _Var9 = generateSeeds(ptVar24,(uint)instance->num_MPC_parties,
                                  puVar11 + instance->seed_size * uVar17,local_4c0.salt,uVar17,
                                  instance);
            if (!_Var9) goto LAB_00117997;
            prVar22 = __ptr + uVar17;
            puVar12 = getLeaves(ptVar24);
            createRandomTapes(prVar22,puVar12,local_4c0.salt,uVar17,instance);
            computeAuxTape(prVar22,inputs[uVar17],instance);
            lVar16 = 0;
            for (uVar19 = 0; uVar15 = (ulong)instance->num_MPC_parties, uVar19 < uVar15;
                uVar19 = uVar19 + 4) {
              leafIndex = (uint)uVar19;
              local_3a0 = (undefined1  [8])getLeaf(ptVar24,leafIndex);
              puStack_398 = getLeaf(ptVar24,leafIndex + 1);
              puStack_390 = getLeaf(ptVar24,leafIndex + 2);
              puStack_388 = getLeaf(ptVar24,leafIndex + 3);
              commit_x4((uint8_t **)((long)commitments[uVar17].hashes + lVar16),
                        (uint8_t **)local_3a0,local_4c0.salt,uVar17,uVar19,instance);
              lVar16 = lVar16 + 0x20;
            }
            puVar12 = commitments[uVar17].hashes[uVar15 - 1];
            puVar13 = getLeaf(ptVar24,(uint)(uVar15 - 1));
            commit(puVar12,puVar13,prVar22->aux_bits,local_4c0.salt,uVar17,uVar15 - 1,instance);
          }
          uVar17 = 0;
LAB_00117430:
          uVar19 = (ulong)instance->num_rounds;
          if (uVar17 < uVar19) goto code_r0x0011743d;
          C = commitments;
          msgs_00 = msgs;
          for (uVar17 = 0; uVar17 < ((uint)uVar19 & 0xfffc); uVar17 = uVar17 + 4) {
            commit_h_x4(local_4d0.hashes + uVar17,commitments + uVar17,instance);
            ppuVar21 = local_4e0.hashes;
            hash_init_x4((hash_context_x4 *)local_3a0,(ulong)instance->digest_size);
            hash_update_x4((hash_context_x4 *)local_3a0,inputs + uVar17,
                           (ulong)instance->input_output_size);
            for (uVar19 = 0; uVar19 < instance->num_MPC_parties; uVar19 = uVar19 + 1) {
              hash_update_x4_4((hash_context_x4 *)local_3a0,msgs_00->msgs[uVar19],
                               msgs_00[1].msgs[uVar19],msgs_00[2].msgs[uVar19],
                               msgs_00[3].msgs[uVar19],(ulong)((int)msgs[uVar17].pos + 7U >> 3));
            }
            hash_final_x4((hash_context_x4 *)local_3a0);
            hash_squeeze_x4((hash_context_x4 *)local_3a0,ppuVar21 + uVar17,
                            (ulong)instance->digest_size);
            uVar19 = (ulong)instance->num_rounds;
            msgs_00 = msgs_00 + 4;
            C = C + 4;
          }
          for (; uVar17 < uVar19; uVar17 = uVar17 + 1) {
            commit_h(local_4d0.hashes[uVar17],C,instance);
            commit_v(local_4e0.hashes[uVar17],inputs[uVar17],msgs_00,instance);
            uVar19 = (ulong)instance->num_rounds;
            msgs_00 = msgs_00 + 1;
            C = C + 1;
          }
          _Var9 = createTree(&local_400,(uint)uVar19,(uint)instance->digest_size);
          if (_Var9) {
            buildMerkleTree(&local_400,local_4e0.hashes,local_4c0.salt,instance);
            puVar8 = local_4c0.challengeP;
            puVar7 = local_4c0.challengeC;
            HCP(local_4c0.challenge,local_4c0.challengeC,local_4c0.challengeP,&local_4d0,
                local_400.nodes,local_4c0.salt,public_key,plaintext,local_458,msglen,instance);
            uVar5 = instance->num_rounds;
            bVar1 = instance->num_opened_rounds;
            missingLeaves = getMissingLeavesList(puVar7,instance);
            local_448 = 0;
            puVar11 = openMerkleTree(&local_400,missingLeaves,(ulong)uVar5 - (ulong)bVar1,&local_448
                                    );
            free(missingLeaves);
            clearTree(&local_400);
            if (puVar11 != (uint8_t *)0x0) {
              local_4c0.cvInfoLen = local_448;
              sVar20 = (ulong)instance->seed_size * (ulong)instance->num_rounds;
              local_4c0.cvInfo = puVar11;
              local_4c0.iSeedInfo = (uint8_t *)malloc(sVar20);
              local_4c0.iSeedInfoLen =
                   revealSeeds(&local_440,puVar7,(ulong)instance->num_opened_rounds,
                               local_4c0.iSeedInfo,sVar20,instance);
              local_4c0.iSeedInfo = (uint8_t *)realloc(local_4c0.iSeedInfo,local_4c0.iSeedInfoLen);
              ppuVar21 = &__ptr->aux_bits;
              ppVar18 = local_4c0.proofs;
              local_550 = __ptr_00;
              local_548 = msgs;
              for (uVar17 = 0; uVar17 < instance->num_rounds; uVar17 = uVar17 + 1) {
                iVar10 = contains(puVar7,(ulong)instance->num_opened_rounds,(uint16_t)uVar17);
                if (iVar10 != 0) {
                  allocateProof2(ppVar18,instance);
                  iVar10 = indexOf(puVar7,(ulong)instance->num_opened_rounds,(uint16_t)uVar17);
                  uVar6 = puVar8[iVar10];
                  ppVar18->unOpenedIndex = uVar6;
                  local_3a0._0_2_ = uVar6;
                  sVar20 = (ulong)instance->seed_size * (ulong)instance->num_MPC_parties;
                  puVar11 = (uint8_t *)malloc(sVar20);
                  ppVar18->seedInfo = puVar11;
                  sVar14 = revealSeeds(local_550,(uint16_t *)local_3a0,1,puVar11,sVar20,instance);
                  ppVar18->seedInfoLen = sVar14;
                  puVar11 = (uint8_t *)realloc(ppVar18->seedInfo,sVar14);
                  ppVar18->seedInfo = puVar11;
                  if ((ulong)instance->num_MPC_parties - 1 != (ulong)puVar8[iVar10]) {
                    memcpy(ppVar18->aux,*ppuVar21,(ulong)instance->view_size);
                  }
                  memcpy(ppVar18->input,inputs[uVar17],(ulong)instance->input_output_size);
                  memcpy(ppVar18->msgs,local_548->msgs[puVar8[iVar10]],(ulong)instance->view_size);
                  bVar1 = instance->num_MPC_parties;
                  uVar5 = ppVar18->unOpenedIndex;
                  puVar11 = ppVar18->C;
                  puVar12 = getLeaf(local_550,(uint)uVar5);
                  if (bVar1 - 1 == (uint)uVar5) {
                    puVar13 = *ppuVar21;
                  }
                  else {
                    puVar13 = (uint8_t *)0x0;
                  }
                  commit(puVar11,puVar12,puVar13,local_4c0.salt,uVar17,(ulong)ppVar18->unOpenedIndex
                         ,instance);
                }
                local_548 = local_548 + 1;
                local_550 = local_550 + 1;
                ppuVar21 = ppuVar21 + 0x13;
                ppVar18 = ppVar18 + 1;
              }
              local_4f0 = 0;
            }
          }
LAB_00117997:
          prVar22 = __ptr;
          ptVar24 = __ptr_00;
          for (uVar17 = 0; uVar17 < instance->num_rounds; uVar17 = uVar17 + 1) {
            freeRandomTape(prVar22);
            clearTree(ptVar24);
            ptVar24 = ptVar24 + 1;
            prVar22 = prVar22 + 1;
          }
          freeCommitments2(&local_4e0);
          freeCommitments2(&local_4d0);
          goto LAB_001179ed;
        }
        local_4f0 = -1;
LAB_001179ed:
        freeMsgs(msgs);
        freeInputs(inputs);
        freeCommitments(commitments);
        free(__ptr_00);
        free(__ptr);
      }
      clearTree(&local_440);
      puVar8 = local_4c0.challengeP;
      puVar7 = local_4c0.challengeC;
      __n = local_4c0.cvInfoLen;
      sVar14 = local_4c0.iSeedInfoLen;
      if (local_4f0 == 0) {
        bVar1 = instance->digest_size;
        uVar17 = *signature_len;
        psVar23 = &(local_4c0.proofs)->seedInfoLen;
        bVar2 = instance->view_size;
        local_550 = (tree_t *)((ulong)bVar1 + 0x20 + local_4c0.cvInfoLen + local_4c0.iSeedInfoLen);
        bVar3 = instance->input_output_size;
        uVar5 = instance->num_rounds;
        for (uVar19 = 0; uVar5 != uVar19; uVar19 = uVar19 + 1) {
          bVar4 = instance->num_opened_rounds;
          iVar10 = contains(puVar7,(ulong)bVar4,(uint16_t)uVar19);
          if (iVar10 != 0) {
            iVar10 = indexOf(puVar7,(ulong)bVar4,(uint16_t)uVar19);
            uVar15 = (ulong)bVar2;
            if (instance->num_MPC_parties - 1 == (uint)puVar8[iVar10]) {
              uVar15 = 0;
            }
            local_550 = (tree_t *)
                        ((long)local_550 + (ulong)((uint)bVar3 + (uint)bVar1 + (uint)bVar2) +
                         *psVar23 + uVar15);
          }
          psVar23 = psVar23 + 7;
        }
        local_4f0 = -1;
        if (local_550 <= uVar17) {
          memcpy(signature,local_4c0.challenge,(ulong)bVar1);
          bVar1 = instance->digest_size;
          puVar11 = signature + (ulong)bVar1 + 0x20;
          *(undefined8 *)(puVar11 + -0x20) = local_4c0.salt._0_8_;
          *(undefined8 *)(puVar11 + -0x18) = local_4c0.salt._8_8_;
          *(undefined8 *)(puVar11 + -0x10) = local_4c0.salt._16_8_;
          *(undefined8 *)(puVar11 + -8) = local_4c0.salt._24_8_;
          memcpy(puVar11,local_4c0.iSeedInfo,sVar14);
          memcpy(signature + sVar14 + 0x20 + (ulong)bVar1,local_4c0.cvInfo,__n);
          puVar11 = signature + sVar14 + 0x20 + (ulong)bVar1 + __n;
          lVar16 = 0;
          for (uVar17 = 0; uVar17 < instance->num_rounds; uVar17 = uVar17 + 1) {
            iVar10 = contains(local_4c0.challengeC,(ulong)instance->num_opened_rounds,
                              (uint16_t)uVar17);
            if (iVar10 != 0) {
              memcpy(puVar11,*(void **)((long)&(local_4c0.proofs)->seedInfo + lVar16),
                     *(size_t *)((long)&(local_4c0.proofs)->seedInfoLen + lVar16));
              ppVar18 = local_4c0.proofs;
              puVar7 = local_4c0.challengeP;
              puVar11 = puVar11 + *(long *)((long)&(local_4c0.proofs)->seedInfoLen + lVar16);
              iVar10 = indexOf(local_4c0.challengeC,(ulong)instance->num_opened_rounds,
                               (uint16_t)uVar17);
              if (instance->num_MPC_parties - 1 != (uint)puVar7[iVar10]) {
                memcpy(puVar11,*(void **)((long)&ppVar18->aux + lVar16),(ulong)instance->view_size);
                puVar11 = puVar11 + instance->view_size;
                ppVar18 = local_4c0.proofs;
              }
              memcpy(puVar11,*(void **)((long)&ppVar18->input + lVar16),
                     (ulong)instance->input_output_size);
              puVar11 = puVar11 + instance->input_output_size;
              memcpy(puVar11,*(void **)((long)&(local_4c0.proofs)->msgs + lVar16),
                     (ulong)instance->view_size);
              bVar1 = instance->view_size;
              memcpy(puVar11 + bVar1,*(void **)((long)&(local_4c0.proofs)->C + lVar16),
                     (ulong)instance->digest_size);
              puVar11 = puVar11 + bVar1 + instance->digest_size;
            }
            lVar16 = lVar16 + 0x38;
          }
          local_4f0 = -1;
          if ((int)local_550 != -1) {
            local_4f0 = 0;
            *signature_len = (long)(int)local_550;
          }
        }
      }
    }
    else {
      local_4f0 = -1;
    }
  }
  freeSignature2(&local_4c0,instance);
  return local_4f0;
code_r0x0011743d:
  puVar11 = inputs[uVar17];
  bVar1 = instance->input_output_size;
  for (uVar19 = 0; bVar1 != uVar19; uVar19 = uVar19 + 1) {
    puVar11[uVar19] = puVar11[uVar19] ^ private_key[uVar19];
  }
  for (uVar19 = (ulong)(instance->lowmc).n; uVar19 < (uint)instance->input_output_size * 8;
      uVar19 = uVar19 + 1) {
    bVar1 = ~(byte)uVar19 & 7;
    puVar11[uVar19 >> 3] = puVar11[uVar19 >> 3] & (-2 << bVar1 | 0xfeU >> 8 - bVar1);
  }
  local_3a0 = (undefined1  [8])0x0;
  puStack_398 = (uint8_t *)0x0;
  puStack_390 = (uint8_t *)0x0;
  puStack_388 = (uint8_t *)0x0;
  mzd_from_char_array((mzd_local_t *)local_3a0,puVar11,(ulong)instance->input_output_size);
  iVar10 = (*local_450)((mzd_local_t *)local_3a0,__ptr + uVar17,msgs + uVar17,&local_420,public_key,
                        instance);
  uVar17 = uVar17 + 1;
  if (iVar10 != 0) goto LAB_00117997;
  goto LAB_00117430;
}

Assistant:

int impl_sign_picnic3(const picnic_instance_t* instance, const uint8_t* plaintext,
                      const uint8_t* private_key, const uint8_t* public_key, const uint8_t* msg,
                      size_t msglen, uint8_t* signature, size_t* signature_len) {
  signature2_t sig;
  int ret = -1;
  if (!allocateSignature2(&sig, instance)) {
    goto Exit;
  }

  ret = sign_picnic3(private_key, public_key, plaintext, msg, msglen, &sig, instance);
  picnic_declassify(&ret, sizeof(ret));
  if (ret != EXIT_SUCCESS) {
#if !defined(NDEBUG)
    fprintf(stderr, "Failed to create signature\n");
    fflush(stderr);
#endif
    goto Exit;
  }

  ret = serializeSignature2(&sig, signature, *signature_len, instance);
  if (ret == -1) {
#if !defined(NDEBUG)
    fprintf(stderr, "Failed to serialize signature\n");
    fflush(stderr);
#endif
    goto Exit;
  }
  *signature_len = ret;
  ret            = 0;

Exit:
  freeSignature2(&sig, instance);
  return ret;
}